

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParserTest.cpp
# Opt level: O3

void __thiscall
ODDLParser::OpenDDLParserTest_parseStringLiteralTest_Test::
~OpenDDLParserTest_parseStringLiteralTest_Test(OpenDDLParserTest_parseStringLiteralTest_Test *this)

{
  pointer ppVVar1;
  
  (this->super_OpenDDLParserTest).super_Test._vptr_Test =
       (_func_int **)&PTR__OpenDDLParserTest_0018aff0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->super_OpenDDLParserTest).m_logs);
  ppVVar1 = (this->super_OpenDDLParserTest).m_data.
            super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppVVar1 != (pointer)0x0) {
    operator_delete(ppVVar1,(long)(this->super_OpenDDLParserTest).m_data.
                                  super__Vector_base<ODDLParser::Value_*,_std::allocator<ODDLParser::Value_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVVar1
                   );
  }
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(OpenDDLParserTest, parseStringLiteralTest) {
    size_t len1(0);
    Value *data(nullptr);
    char token1[] = "\"teststring\"", *end1(findEnd(token1, len1));
    char *in(token1);

    char *out = OpenDDLParser::parseStringLiteral(token1, end1, &data);
    EXPECT_NE(in, out);
    EXPECT_FALSE(nullptr == data);
    EXPECT_EQ(Value::ValueType::ddl_string, data->m_type);
    std::string str((char *)data->m_data);
    int res(::strncmp("teststring", str.c_str(), str.size()));
    EXPECT_EQ(0, res);
    registerValueForDeletion(data);
}